

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O1

string * __thiscall
OpenMD::DefaultAtomVisitor::toString_abi_cxx11_
          (string *__return_storage_ptr__,DefaultAtomVisitor *this)

{
  char buffer [65535];
  char acStack_10018 [65536];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  builtin_strncpy(acStack_10018,"--------------------------------------------------------------\n",
                  0x40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(acStack_10018,0xffff,"Visitor name: %s\n",
           (this->super_BaseAtomVisitor).super_BaseVisitor.visitorName._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  builtin_strncpy(acStack_10018,"Visitor Description: copy atom infomation into atom data\n",0x3a);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  builtin_strncpy(acStack_10018,"--------------------------------------------------------------\n",
                  0x40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string DefaultAtomVisitor::toString() {
    char buffer[65535];
    std::string result;

    snprintf(
        buffer, 65535,
        "--------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(buffer, 65535,
             "Visitor Description: copy atom infomation into atom data\n");
    result += buffer;

    snprintf(
        buffer, 65535,
        "--------------------------------------------------------------\n");
    result += buffer;

    return result;
  }